

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::testGroupEnded
          (CumulativeReporterBase *this,TestGroupStats *testGroupStats)

{
  pointer pcVar1;
  pointer pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  pointer pPVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *pNVar16;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  node;
  value_type local_20;
  
  pNVar16 = (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
             *)operator_new(0x98);
  (pNVar16->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (pNVar16->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_0017dac8;
  (pNVar16->value)._vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_0017bc98;
  (pNVar16->value).groupInfo.name._M_dataplus._M_p =
       (pointer)&(pNVar16->value).groupInfo.name.field_2;
  pcVar1 = (testGroupStats->groupInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pNVar16->value).groupInfo,pcVar1,
             pcVar1 + (testGroupStats->groupInfo).name._M_string_length);
  sVar7 = (testGroupStats->groupInfo).groupsCounts;
  (pNVar16->value).groupInfo.groupIndex = (testGroupStats->groupInfo).groupIndex;
  (pNVar16->value).groupInfo.groupsCounts = sVar7;
  sVar7 = (testGroupStats->totals).assertions.failed;
  sVar12 = (testGroupStats->totals).assertions.failedButOk;
  uVar3 = *(undefined4 *)((long)&(testGroupStats->totals).assertions.failedButOk + 4);
  sVar13 = (testGroupStats->totals).testCases.passed;
  uVar4 = *(undefined4 *)((long)&(testGroupStats->totals).testCases.passed + 4);
  sVar14 = (testGroupStats->totals).testCases.failed;
  uVar5 = *(undefined4 *)((long)&(testGroupStats->totals).testCases.failed + 4);
  sVar15 = (testGroupStats->totals).testCases.failedButOk;
  uVar6 = *(undefined4 *)((long)&(testGroupStats->totals).testCases.failedButOk + 4);
  (pNVar16->value).totals.assertions.passed = (testGroupStats->totals).assertions.passed;
  (pNVar16->value).totals.assertions.failed = sVar7;
  *(int *)&(pNVar16->value).totals.assertions.failedButOk = (int)sVar12;
  *(undefined4 *)((long)&(pNVar16->value).totals.assertions.failedButOk + 4) = uVar3;
  *(int *)&(pNVar16->value).totals.testCases.passed = (int)sVar13;
  *(undefined4 *)((long)&(pNVar16->value).totals.testCases.passed + 4) = uVar4;
  *(int *)&(pNVar16->value).totals.testCases.failed = (int)sVar14;
  *(undefined4 *)((long)&(pNVar16->value).totals.testCases.failed + 4) = uVar5;
  *(int *)&(pNVar16->value).totals.testCases.failedButOk = (int)sVar15;
  *(undefined4 *)((long)&(pNVar16->value).totals.testCases.failedButOk + 4) = uVar6;
  (pNVar16->value).aborting = testGroupStats->aborting;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.m_p = pNVar16;
  (*(pNVar16->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2]
  )(pNVar16);
  pPVar2 = (pNVar16->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar8 = (this->m_testCases).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (this->m_testCases).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testCases).
       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar10 = (pNVar16->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar11 = (pNVar16->children).
            super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar8;
  (pNVar16->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar10;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar11;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar2;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ::push_back(&this->m_testGroups,&local_20);
  if (local_20.m_p !=
      (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
       *)0x0) {
    (*((local_20.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) CATCH_OVERRIDE {
            Ptr<TestGroupNode> node = new TestGroupNode( testGroupStats );
            node->children.swap( m_testCases );
            m_testGroups.push_back( node );
        }